

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<32,151>::
GeneralCovarianceBase<njoy::ENDFtk::section::Type<32,151>::ShortRangeReichMooreBlock,njoy::ENDFtk::section::Type<32,151>::ReichMooreScatteringRadiusUncertainties,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore>
::print<std::back_insert_iterator<std::__cxx11::string>>
          (GeneralCovarianceBase<njoy::ENDFtk::section::Type<32,151>::ShortRangeReichMooreBlock,njoy::ENDFtk::section::Type<32,151>::ReichMooreScatteringRadiusUncertainties,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore>
           *this,back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *it,int MAT,int MF,int MT)

{
  undefined1 auVar1 [16];
  ListRecord *pLVar2;
  variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix> *pvVar3;
  ShortRangeReichMooreBlock *cshort;
  ListRecord *this_00;
  variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix> *clong;
  variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix> *__variants;
  int local_74;
  int local_70;
  int local_6c;
  GeneralCovarianceBase<njoy::ENDFtk::section::Type<32,151>::ShortRangeReichMooreBlock,njoy::ENDFtk::section::Type<32,151>::ReichMooreScatteringRadiusUncertainties,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore>
  *local_68;
  undefined1 local_60 [48];
  
  local_60._8_8_ = ZEXT48(*(uint *)(this + 0x10));
  local_60._1_7_ = 0;
  local_60[0] = this[0x68];
  local_60._16_8_ = 1;
  local_60._24_8_ = 0;
  auVar1 = *(undefined1 (*) [16])this;
  local_60._40_4_ = auVar1._0_4_;
  local_60._32_8_ = auVar1._8_8_;
  local_60._44_4_ = auVar1._4_4_;
  local_74 = MT;
  local_70 = MF;
  local_6c = MAT;
  ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ControlRecord *)local_60,it,MAT,MF,MT);
  if (this[0x68] ==
      (GeneralCovarianceBase<njoy::ENDFtk::section::Type<32,151>::ShortRangeReichMooreBlock,njoy::ENDFtk::section::Type<32,151>::ReichMooreScatteringRadiusUncertainties,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore>
       )0x1) {
    ListRecord::print<std::back_insert_iterator<std::__cxx11::string>>
              ((ListRecord *)(this + 0x20),it,MAT,MF,MT);
  }
  local_60._8_8_ =
       SEXT48((int)((ulong)(*(long *)(this + 0x78) - *(long *)(this + 0x70)) >> 3) * 0x38e38e39);
  local_60._0_8_ =
       SEXT48((int)((ulong)(*(long *)(this + 0x90) - *(long *)(this + 0x88)) >> 4) * -0x33333333);
  local_60._16_8_ = 0;
  local_60._24_8_ = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(this + 0x18);
  local_60._32_16_ = auVar1 << 0x40;
  ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ControlRecord *)local_60,it,MAT,MF,MT);
  pLVar2 = *(ListRecord **)(this + 0x78);
  local_68 = this;
  for (this_00 = *(ListRecord **)(this + 0x70); this_00 != pLVar2; this_00 = this_00 + 1) {
    ListRecord::print<std::back_insert_iterator<std::__cxx11::string>>(this_00,it,MAT,MF,MT);
  }
  __variants = *(variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix>
                 **)(local_68 + 0x88);
  pvVar3 = *(variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix> **
            )(local_68 + 0x90);
  if (__variants != pvVar3) {
    do {
      local_60._8_8_ = &local_6c;
      local_60._0_8_ = it;
      local_60._16_8_ = &local_70;
      local_60._24_8_ = &local_74;
      std::
      visit<njoy::ENDFtk::section::Type<32,151>::GeneralCovarianceBase<njoy::ENDFtk::section::Type<32,151>::ShortRangeReichMooreBlock,njoy::ENDFtk::section::Type<32,151>::ReichMooreScatteringRadiusUncertainties,njoy::ENDFtk::section::Type<32,151>::GeneralReichMoore>::print<std::back_insert_iterator<std::__cxx11::string>>(std::back_insert_iterator<std::__cxx11::string>&,int,int,int)const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::CovariancePairs,njoy::ENDFtk::section::SquareMatrix>const&>
                ((anon_class_32_4_f17ee1e6 *)local_60,__variants);
      __variants = __variants + 1;
    } while (__variants != pvVar3);
  }
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

  ControlRecord( this->SPI(), this->AP(),
                 0, this->LCOMP(),
                 this->NLS(), this->ISR() ).print( it, MAT, MF, MT );
  if ( this->ISR() ) {

    Derived::print( this->dap_.value(), it, MAT, MF, MT );
  }
  ControlRecord( this->AWRI(), 0., 0, 0,
                 this->NSRS(), this->NLRS() ).print( it, MAT, MF, MT );
  for ( const auto& cshort : this->short_ ) {

    Derived::print( cshort, it, MAT, MF, MT );
  }
  for ( const auto& clong : this->long_ ) {

    std::visit( [&] ( const auto& v ) -> void
                    { return v.print( it, MAT, MF, MT ); },
                clong );
  }
}